

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<double>::TPZVec(TPZVec<double> *this,TPZVec<double> *copy)

{
  ulong uVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649128;
  this->fStore = (double *)0x0;
  uVar1 = copy->fNElements;
  if ((long)uVar1 < 1) {
    pdVar3 = (double *)0x0;
  }
  else {
    pdVar3 = (double *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
  }
  this->fStore = pdVar3;
  pdVar2 = copy->fStore;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (long)uVar1) {
    uVar5 = uVar1;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pdVar3[uVar4] = pdVar2[uVar4];
  }
  this->fNElements = uVar1;
  this->fNAlloc = copy->fNAlloc;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const TPZVec<T> &copy){
	fStore = nullptr;
	
	if( copy.fNElements > 0 )
		fStore = new T[copy.fNElements];
	else
		fStore = nullptr;
	
	for(int64_t i=0; i<copy.fNElements; i++)
		fStore[i]=copy.fStore[i];
	
	fNElements = copy.fNElements;
    fNAlloc = copy.fNAlloc;
}